

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShellPointerArray::UtestShellPointerArray(UtestShellPointerArray *this,UtestShell *firstTest)

{
  size_t size;
  void *pvVar1;
  long *in_RSI;
  long *in_RDI;
  size_t i;
  UtestShell *currentTest;
  char *in_stack_ffffffffffffffc8;
  ulong local_20;
  long *local_18;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  if (in_RSI == (long *)0x0) {
    size = 0;
  }
  else {
    size = (**(code **)(*in_RSI + 0x20))();
  }
  in_RDI[1] = size;
  if (in_RDI[1] != 0) {
    pvVar1 = operator_new__(size,in_stack_ffffffffffffffc8,0);
    *in_RDI = (long)pvVar1;
    local_18 = in_RSI;
    for (local_20 = 0; local_20 < (ulong)in_RDI[1]; local_20 = local_20 + 1) {
      *(long **)(*in_RDI + local_20 * 8) = local_18;
      local_18 = (long *)(**(code **)(*local_18 + 0x18))();
    }
  }
  return;
}

Assistant:

UtestShellPointerArray::UtestShellPointerArray(UtestShell* firstTest)
    : arrayOfTests_(NULLPTR), count_(0)
{
    count_ = (firstTest) ? firstTest->countTests() : 0;
    if (count_ == 0) return;

    arrayOfTests_ = new UtestShell*[count_];

    UtestShell*currentTest = firstTest;
    for (size_t i = 0; i < count_; i++)
    {
        arrayOfTests_[i] = currentTest;
        currentTest = currentTest->getNext();
    }
}